

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53lxx.cpp
# Opt level: O1

void __thiscall VL53LXX::powerOn(VL53LXX *this)

{
  mutex *__mutex;
  char cVar1;
  int iVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  char unaff_BPL;
  pointer unaff_R12;
  ofstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  initGPIO(this);
  if (-1 < this->xshutGPIOPin) {
    __mutex = &this->fileAccessMutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar3 = std::__throw_system_error(iVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if (local_268._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if (unaff_BPL != '\0') {
        __cxa_free_exception();
      }
      std::ofstream::~ofstream(&local_228);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar3);
    }
    std::ofstream::ofstream(&local_228);
    std::ofstream::open((char *)&local_228,(_Ios_Openmode)(this->gpioFilename)._M_dataplus._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if ((cVar1 == '\0') || (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) != 0)) {
      std::ofstream::close();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,"Failed opening file: ","");
      std::operator+(&local_248,&local_268,&this->gpioFilename);
      std::runtime_error::runtime_error(this_00,(string *)&local_248);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"1",1);
    std::ofstream::close();
    usleep(2000);
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void VL53LXX::powerOn() {
	this->initGPIO();

	if (this->xshutGPIOPin >= 0) {
		std::lock_guard<std::mutex> guard(this->fileAccessMutex);
		std::ofstream file;

		file.open(this->gpioFilename.c_str(), std::ofstream::out);
		if (!file.is_open() || !file.good()) {
			file.close();
			throw(std::runtime_error(std::string("Failed opening file: ") + this->gpioFilename));
		}
		file << "1";
		file.close();

		// t_boot is 1.2ms max, wait 2ms just to be sure
		usleep(2000);
	}
}